

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O1

void __thiscall
wabt::Module::AppendField
          (Module *this,
          unique_ptr<wabt::GlobalModuleField,_std::default_delete<wabt::GlobalModuleField>_> *field)

{
  size_t *psVar1;
  GlobalModuleField *pGVar2;
  ModuleField *pMVar3;
  ModuleFieldList *pMVar4;
  Global *local_48;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  int local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  undefined4 local_28;
  
  pGVar2 = (field->_M_t).
           super___uniq_ptr_impl<wabt::GlobalModuleField,_std::default_delete<wabt::GlobalModuleField>_>
           ._M_t.
           super__Tuple_impl<0UL,_wabt::GlobalModuleField_*,_std::default_delete<wabt::GlobalModuleField>_>
           .super__Head_base<0UL,_wabt::GlobalModuleField_*,_false>._M_head_impl;
  if (*(size_type *)((long)&(pGVar2->global).name + 8) != 0) {
    local_48 = (Global *)
               (((Location *)
                ((long)&(pGVar2->super_ModuleFieldMixin<(wabt::ModuleFieldType)1>).super_ModuleField
                + 0x18))->filename)._M_len;
    uStack_40 = *(undefined4 *)
                 ((long)&(pGVar2->super_ModuleFieldMixin<(wabt::ModuleFieldType)1>).
                         super_ModuleField + 0x20);
    uStack_3c = *(undefined4 *)
                 ((long)&(pGVar2->super_ModuleFieldMixin<(wabt::ModuleFieldType)1>).
                         super_ModuleField + 0x24);
    local_38 = (((anon_union_16_2_ecfd7102_for_Location_1 *)
                ((long)&(pGVar2->super_ModuleFieldMixin<(wabt::ModuleFieldType)1>).super_ModuleField
                + 0x28))->field_0).line;
    uStack_34 = *(undefined4 *)
                 ((long)&(pGVar2->super_ModuleFieldMixin<(wabt::ModuleFieldType)1>).
                         super_ModuleField + 0x2c);
    uStack_30 = *(undefined4 *)
                 ((long)&(pGVar2->super_ModuleFieldMixin<(wabt::ModuleFieldType)1>).
                         super_ModuleField + 0x30);
    uStack_2c = *(undefined4 *)
                 ((long)&(pGVar2->super_ModuleFieldMixin<(wabt::ModuleFieldType)1>).
                         super_ModuleField + 0x34);
    local_28 = (undefined4)
               ((ulong)((long)(this->globals).
                              super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->globals).
                             super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>.
                             _M_impl.super__Vector_impl_data._M_start) >> 3);
    std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,wabt::Binding>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
    ::_M_emplace<std::__cxx11::string&,wabt::Binding>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,wabt::Binding>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
                *)&this->global_bindings,0,&pGVar2->global);
  }
  local_48 = &pGVar2->global;
  std::vector<wabt::Global*,std::allocator<wabt::Global*>>::emplace_back<wabt::Global*>
            ((vector<wabt::Global*,std::allocator<wabt::Global*>> *)&this->globals,&local_48);
  pGVar2 = (field->_M_t).
           super___uniq_ptr_impl<wabt::GlobalModuleField,_std::default_delete<wabt::GlobalModuleField>_>
           ._M_t.
           super__Tuple_impl<0UL,_wabt::GlobalModuleField_*,_std::default_delete<wabt::GlobalModuleField>_>
           .super__Head_base<0UL,_wabt::GlobalModuleField_*,_false>._M_head_impl;
  (field->_M_t).
  super___uniq_ptr_impl<wabt::GlobalModuleField,_std::default_delete<wabt::GlobalModuleField>_>._M_t
  .super__Tuple_impl<0UL,_wabt::GlobalModuleField_*,_std::default_delete<wabt::GlobalModuleField>_>.
  super__Head_base<0UL,_wabt::GlobalModuleField_*,_false>._M_head_impl = (GlobalModuleField *)0x0;
  if ((*(ModuleField **)
        ((long)&(pGVar2->super_ModuleFieldMixin<(wabt::ModuleFieldType)1>).super_ModuleField + 0x10)
       == (ModuleField *)0x0) &&
     (((intrusive_list_base<wabt::ModuleField> *)
      ((long)&(pGVar2->super_ModuleFieldMixin<(wabt::ModuleFieldType)1>).super_ModuleField + 8))->
      next_ == (ModuleField *)0x0)) {
    pMVar3 = (this->fields).last_;
    if (pMVar3 == (ModuleField *)0x0) {
      pMVar4 = &this->fields;
    }
    else {
      *(ModuleField **)
       ((long)&(pGVar2->super_ModuleFieldMixin<(wabt::ModuleFieldType)1>).super_ModuleField + 0x10)
           = pMVar3;
      pMVar4 = (ModuleFieldList *)&pMVar3->super_intrusive_list_base<wabt::ModuleField>;
    }
    pMVar4->first_ = (ModuleField *)pGVar2;
    (this->fields).last_ = (ModuleField *)pGVar2;
    psVar1 = &(this->fields).size_;
    *psVar1 = *psVar1 + 1;
    return;
  }
  __assert_fail("node->prev_ == nullptr && node->next_ == nullptr",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/include/wabt/intrusive-list.h"
                ,0x1bd,
                "void wabt::intrusive_list<wabt::ModuleField>::push_back(std::unique_ptr<T>) [T = wabt::ModuleField]"
               );
}

Assistant:

void Module::AppendField(std::unique_ptr<GlobalModuleField> field) {
  Global& global = field->global;
  if (!global.name.empty()) {
    global_bindings.emplace(global.name, Binding(field->loc, globals.size()));
  }
  globals.push_back(&global);
  fields.push_back(std::move(field));
}